

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O1

bool __thiscall Generation::wasUpdated(Generation *this)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  MutexLocker lock;
  unsigned_long onDisk;
  File genFile;
  MutexLocker local_b0;
  unsigned_long local_a0;
  File local_98;
  string local_60;
  string local_40;
  
  if (this->isToken == true) {
    MutexLocker::MutexLocker(&local_b0,this->genMutex);
    pcVar1 = (this->path)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (this->path)._M_string_length);
    File::File(&local_98,&local_60,this->umask,true,false,false,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    bVar2 = File::isValid(&local_98);
    bVar3 = true;
    if (bVar2) {
      File::lock(&local_98,true);
      bVar2 = File::readULong(&local_98,&local_a0);
      bVar3 = true;
      if (bVar2) {
        if (local_a0 == this->currentValue) {
          bVar3 = false;
        }
        else {
          this->currentValue = local_a0;
        }
      }
    }
    File::~File(&local_98);
    MutexLocker::~MutexLocker(&local_b0);
  }
  else {
    pcVar1 = (this->path)._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + (this->path)._M_string_length);
    File::File(&local_98,&local_40,this->umask,true,false,false,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    bVar2 = File::isValid(&local_98);
    bVar3 = true;
    if (bVar2) {
      File::lock(&local_98,true);
      bVar2 = File::readULong(&local_98,(unsigned_long *)&local_b0);
      bVar3 = !bVar2 || local_b0._vptr_MutexLocker != (_func_int **)this->currentValue;
    }
    File::~File(&local_98);
  }
  return bVar3;
}

Assistant:

bool Generation::wasUpdated()
{
	if (isToken)
	{
		MutexLocker lock(genMutex);

		File genFile(path, umask);

		if (!genFile.isValid())
		{
			return true;
		}

		genFile.lock();

		unsigned long onDisk;

		if (!genFile.readULong(onDisk))
		{
			return true;
		}

		if (onDisk != currentValue)
		{
			currentValue = onDisk;
			return true;
		}

		return false;
	}
	else
	{
		File objectFile(path, umask);

		if (!objectFile.isValid())
		{
			return true;
		}

		objectFile.lock();

		unsigned long onDisk;

		if (!objectFile.readULong(onDisk))
		{
			return true;
		}

		return (onDisk != currentValue);
	}
}